

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

int __thiscall Catch::Session::run(Session *this)

{
  int iVar1;
  ostream *poVar2;
  
  if (((this->m_configData).waitForKeypress & BeforeStart) != Never) {
    std::operator<<((ostream *)&std::cout,"...waiting for enter/ return before starting\n");
    std::ostream::flush();
    getchar();
  }
  iVar1 = runInternal(this);
  if (((this->m_configData).waitForKeypress & BeforeExit) != Never) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "...waiting for enter/ return before exiting, with code: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    std::operator<<(poVar2,'\n');
    std::ostream::flush();
    getchar();
  }
  return iVar1;
}

Assistant:

int Session::run() {
        if( ( m_configData.waitForKeypress & WaitForKeypress::BeforeStart ) != 0 ) {
            Catch::cout() << "...waiting for enter/ return before starting\n" << std::flush;
            static_cast<void>(std::getchar());
        }
        int exitCode = runInternal();
        if( ( m_configData.waitForKeypress & WaitForKeypress::BeforeExit ) != 0 ) {
            Catch::cout() << "...waiting for enter/ return before exiting, with code: " << exitCode << '\n' << std::flush;
            static_cast<void>(std::getchar());
        }
        return exitCode;
    }